

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O2

int fffi4u8(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,ULONGLONG nullval
           ,char *nullarray,int *anynull,ULONGLONG *output,int *status)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ULONGLONG UVar4;
  double dVar5;
  
  if (nullcheck == 0) {
    lVar2 = 0;
    if (0 < ntodo) {
      lVar2 = ntodo;
    }
    lVar3 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        dVar5 = (double)input[lVar3] * scale + zero;
        if (0.0 <= dVar5) {
          if (dVar5 <= 1.8446744073709552e+19) {
            UVar4 = (ULONGLONG)dVar5;
          }
          else {
            *status = -0xb;
            UVar4 = 0xffffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          UVar4 = 0;
        }
        output[lVar3] = UVar4;
      }
    }
    else {
      for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        UVar4 = (ULONGLONG)input[lVar3];
        if ((long)UVar4 < 0) {
          *status = -0xb;
          UVar4 = 0;
        }
        output[lVar3] = UVar4;
      }
    }
  }
  else {
    lVar2 = 0;
    if (0 < ntodo) {
      lVar2 = ntodo;
    }
    lVar3 = 0;
    if (scale != 1.0 || zero != 0.0) {
      for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        if (input[lVar3] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else {
          dVar5 = (double)input[lVar3] * scale + zero;
          if (0.0 <= dVar5) {
            if (dVar5 <= 1.8446744073709552e+19) {
              output[lVar3] =
                   (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
            }
            else {
              *status = -0xb;
              output[lVar3] = 0xffffffffffffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar3] = 0;
          }
        }
      }
    }
    else {
      for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        uVar1 = input[lVar3];
        if (uVar1 == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else if ((int)uVar1 < 0) {
          *status = -0xb;
          output[lVar3] = 0;
        }
        else {
          output[lVar3] = (ulong)uVar1;
        }
      }
    }
  }
  return *status;
}

Assistant:

int fffi4u8(INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            ULONGLONG nullval,     /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            ULONGLONG *output,     /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
	    {
	        if (input[ii] < 0) 
		{
                   *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
		else
		{
                   output[ii] = (ULONGLONG) input[ii];   /* copy input to output */
		}
	    }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < 0)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DULONGLONG_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT64_MAX;
                }
                else
                    output[ii] = (LONGLONG) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
	        else if (input[ii] < 0) 
		{
                   *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else
		{
                    output[ii] = (ULONGLONG) input[ii];
		}
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < 0)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DULONGLONG_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT64_MAX;
                    }
                    else
                        output[ii] = (ULONGLONG) dvalue;
                }
            }
        }
    }
    return(*status);
}